

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emu2149.c
# Opt level: O3

void update_output(EPSG *psg)

{
  uint uVar1;
  uint uVar2;
  byte bVar3;
  long lVar4;
  uint8_t uVar5;
  ushort uVar6;
  uint uVar7;
  ulong uVar8;
  byte bVar9;
  char cVar10;
  
  uVar1 = psg->base_count + psg->base_incr;
  psg->base_count = uVar1 & 0xffffff;
  uVar2 = psg->env_count + (uVar1 >> 0x18);
  if (0xffff < uVar2) {
    bVar9 = psg->env_ptr;
    uVar5 = psg->env_pause;
    do {
      if (uVar5 == '\0') {
        cVar10 = '?';
        if (psg->env_face != '\0') {
          cVar10 = '\x01';
        }
        bVar9 = bVar9 + cVar10 & 0x3f;
        psg->env_ptr = bVar9;
      }
      if ((bVar9 & 0x20) != 0) {
        if (psg->env_continue == '\0') {
          psg->env_pause = '\x01';
          uVar5 = '\x01';
LAB_0015ab75:
          bVar9 = 0;
        }
        else {
          if (psg->env_alternate != psg->env_hold) {
            psg->env_face = psg->env_face ^ 1;
          }
          if (psg->env_hold != '\0') {
            psg->env_pause = '\x01';
            uVar5 = '\x01';
          }
          bVar9 = 0x1f;
          if (psg->env_face != '\0') goto LAB_0015ab75;
        }
        psg->env_ptr = bVar9;
      }
      uVar2 = uVar2 - (psg->env_freq + (uint)(psg->env_freq == 0));
    } while (0xffff < uVar2);
  }
  psg->env_count = uVar2;
  bVar9 = (byte)(uVar1 >> 0x18);
  bVar3 = psg->noise_count + bVar9;
  psg->noise_count = bVar3;
  uVar1 = psg->noise_seed;
  if ((bVar3 & 0x40) != 0) {
    uVar7 = uVar1 >> 1;
    uVar2 = uVar1 & 1;
    uVar1 = uVar7 ^ 0x12000;
    if (uVar2 == 0) {
      uVar1 = uVar7;
    }
    psg->noise_seed = uVar1;
    uVar5 = '\x02';
    if (psg->noise_freq != '\0') {
      uVar5 = psg->noise_freq;
    }
    psg->noise_count = bVar3 - uVar5;
  }
  lVar4 = 0;
  do {
    uVar6 = psg->count[lVar4] + (ushort)bVar9;
    psg->count[lVar4] = uVar6;
    if ((uVar6 >> 0xc & 1) != 0) {
      if (psg->freq[lVar4] < 2) {
        psg->edge[lVar4] = '\x01';
      }
      else {
        psg->edge[lVar4] = psg->edge[lVar4] == '\0';
        psg->count[lVar4] = psg->count[lVar4] - psg->freq[lVar4];
      }
    }
    psg->ch_out[lVar4] = 0;
    if ((((psg->mask >> ((uint)lVar4 & 0x1f) & 1) == 0) &&
        ((psg->tmask[lVar4] != '\0' || (psg->edge[lVar4] != '\0')))) &&
       ((psg->nmask[lVar4] != '\0' || ((uVar1 & 1) != 0)))) {
      if ((psg->volume[lVar4] & 0x20) == 0) {
        uVar8 = (ulong)(psg->volume[lVar4] & 0x1f);
      }
      else {
        uVar8 = (ulong)psg->env_ptr;
      }
      psg->ch_out[lVar4] = (int16_t)(psg->voltbl[uVar8] << 5);
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  return;
}

Assistant:

INLINE void
update_output (EPSG * psg)
{

  int i, noise;
  uint32_t incr;

  psg->base_count += psg->base_incr;
  incr = (psg->base_count >> GETA_BITS);
  psg->base_count &= (1 << GETA_BITS) - 1;

  /* Envelope */
  psg->env_count += incr;
  while (psg->env_count>=0x10000)
  {
    if (!psg->env_pause)
    {
      if(psg->env_face)
        psg->env_ptr = (psg->env_ptr + 1) & 0x3f ; 
      else
        psg->env_ptr = (psg->env_ptr + 0x3f) & 0x3f;
    }

    if (psg->env_ptr & 0x20) /* if carry or borrow */
    {
      if (psg->env_continue)
      {
        if (psg->env_alternate^psg->env_hold) psg->env_face ^= 1;
        if (psg->env_hold) psg->env_pause = 1;
        psg->env_ptr = psg->env_face?0:0x1f;       
      }
      else
      {
        psg->env_pause = 1;
        psg->env_ptr = 0;
      }
    }

    psg->env_count -= psg->env_freq?psg->env_freq:1; /* env_freq 0 is the same as 1. */
  }

  /* Noise */
  psg->noise_count += incr;
  if (psg->noise_count & 0x40)
  {
    if (psg->noise_seed & 1)
      psg->noise_seed ^= 0x24000;
    psg->noise_seed >>= 1;
    psg->noise_count -= psg->noise_freq?psg->noise_freq:(1<<1);
  }
  noise = psg->noise_seed & 1;

  /* Tone */
  for (i = 0; i < 3; i++)
  {
    psg->count[i] += incr;
    if (psg->count[i] & 0x1000)
    {
      if (psg->freq[i] > 1)
      {
        psg->edge[i] = !psg->edge[i];
        psg->count[i] -= psg->freq[i];
      }
      else
      {
        psg->edge[i] = 1;
      }
    }

    psg->ch_out[i] = 0;

    if (psg->mask&EPSG_MASK_CH(i))
      continue;

    if ((psg->tmask[i]||psg->edge[i]) && (psg->nmask[i]||noise))
    {
      if (!(psg->volume[i] & 32))
        psg->ch_out[i] = (psg->voltbl[psg->volume[i] & 31] << 5);
      else
        psg->ch_out[i] = (psg->voltbl[psg->env_ptr] << 5);
    }

    //psg->ch_out[i] >>= 1;

  }

}